

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

size_t __thiscall
c4::basic_substring<const_char>::find
          (basic_substring<const_char> *this,ro_substr pattern,size_t start_pos)

{
  basic_substring<const_char> *pbVar1;
  basic_substring<const_char> *pbVar2;
  ulong uVar3;
  basic_substring<const_char> *pbVar4;
  basic_substring<const_char> *pbVar5;
  ulong uVar6;
  bool bVar7;
  
  uVar3 = pattern.len;
  pbVar5 = this;
  if ((start_pos != 0xffffffffffffffff) && (this->len < start_pos)) {
    basic_substring<char_const>::find();
  }
  pbVar1 = (basic_substring<const_char> *)0xffffffffffffffff;
  if ((uVar3 <= this->len) &&
     (pbVar4 = (basic_substring<const_char> *)((this->len - uVar3) + 1), start_pos < pbVar4)) {
    do {
      pbVar2 = (basic_substring<const_char> *)start_pos;
      bVar7 = uVar3 != 0;
      if (uVar3 != 0) {
        uVar6 = 0;
        do {
          if (this->len <= (long)&((basic_substring<const_char> *)start_pos)->str + uVar6) {
            basic_substring<char_const>::find();
          }
          pbVar2 = pbVar5;
          if (*(char *)((long)&((basic_substring<const_char> *)start_pos)->str +
                       (long)(this->str + uVar6)) != pattern.str[uVar6]) break;
          uVar6 = uVar6 + 1;
          bVar7 = uVar6 < uVar3;
          pbVar2 = (basic_substring<const_char> *)start_pos;
        } while (uVar6 != uVar3);
      }
      pbVar1 = pbVar2;
    } while ((bVar7) &&
            (start_pos = (long)&((basic_substring<const_char> *)start_pos)->str + 1,
            pbVar1 = (basic_substring<const_char> *)0xffffffffffffffff, pbVar5 = pbVar2,
            start_pos < pbVar4));
  }
  return (size_t)pbVar1;
}

Assistant:

inline size_t find(ro_substr pattern, size_t start_pos=0) const
    {
        C4_ASSERT(start_pos == npos || (start_pos >= 0 && start_pos <= len));
        if(len < pattern.len) return npos;
        for(size_t i = start_pos, e = len - pattern.len + 1; i < e; ++i)
        {
            bool gotit = true;
            for(size_t j = 0; j < pattern.len; ++j)
            {
                C4_ASSERT(i + j < len);
                if(str[i + j] != pattern.str[j])
                {
                    gotit = false;
                    break;
                }
            }
            if(gotit)
            {
                return i;
            }
        }
        return npos;
    }